

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O3

void __thiscall
cppcms::widgets::numeric<double>::render_value(numeric<double> *this,form_context *context)

{
  char cVar1;
  ostream *poVar2;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  cVar1 = cppcms::widgets::base_widget::set();
  poVar2 = (ostream *)cppcms::form_context::out();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"value=\"",7);
  if (cVar1 != '\0') {
    poVar2 = std::ostream::_M_insert<double>(this->value_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
    return;
  }
  cppcms::util::escape((string *)&local_40);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ",2);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return;
}

Assistant:

virtual void render_value(form_context &context)
			{
				if(set())
					context.out()<<"value=\""<<value_<<"\" ";
				else
					context.out()<<"value=\""<<util::escape(loaded_string_)<<"\" ";
			}